

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void lex_match(LexState *ls,LexToken what,LexToken who,BCLine line)

{
  char *pcVar1;
  char *pcVar2;
  
  if (ls->tok == what) {
    lj_lex_next(ls);
    return;
  }
  if (ls->linenumber == line) {
    err_token(ls,what);
  }
  pcVar1 = lj_lex_token2str(ls,what);
  pcVar2 = lj_lex_token2str(ls,who);
  lj_lex_error(ls,ls->tok,LJ_ERR_XMATCH,pcVar1,pcVar2,(ulong)(uint)line);
}

Assistant:

static void lex_match(LexState *ls, LexToken what, LexToken who, BCLine line)
{
  if (!lex_opt(ls, what)) {
    if (line == ls->linenumber) {
      err_token(ls, what);
    } else {
      const char *swhat = lj_lex_token2str(ls, what);
      const char *swho = lj_lex_token2str(ls, who);
      lj_lex_error(ls, ls->tok, LJ_ERR_XMATCH, swhat, swho, line);
    }
  }
}